

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

void __thiscall S2Polyline::S2Polyline(S2Polyline *this,S2Polyline *src)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Vector3<double> *__p;
  type __first;
  type __last;
  type __result;
  Vector3<double> *local_50;
  S2Polyline *src_local;
  S2Polyline *this_local;
  
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polyline_0062ebc0;
  this->num_vertices_ = src->num_vertices_;
  uVar2 = (ulong)this->num_vertices_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __p = (Vector3<double> *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_50 = __p;
    do {
      Vector3<double>::Vector3(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != __p + uVar2);
  }
  std::unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>>::
  unique_ptr<Vector3<double>*,std::default_delete<Vector3<double>[]>,void,bool>
            ((unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>> *)
             &this->vertices_,__p);
  __first = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                      (&src->vertices_,0);
  __last = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                     (&src->vertices_,(long)this->num_vertices_);
  __result = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                       (&this->vertices_,0);
  std::copy<Vector3<double>*,Vector3<double>*>(__first,__last,__result);
  return;
}

Assistant:

S2Polyline::S2Polyline(const S2Polyline& src)
  : num_vertices_(src.num_vertices_),
    vertices_(new S2Point[num_vertices_]) {
  std::copy(&src.vertices_[0], &src.vertices_[num_vertices_], &vertices_[0]);
}